

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O2

void __thiscall
QtMWidgets::PickerPrivate::makeNextIndex(PickerPrivate *this,QPersistentModelIndex *index)

{
  int iVar1;
  int iVar2;
  long lVar3;
  QAbstractItemModel *pQVar4;
  QModelIndex local_60;
  QModelIndex local_48;
  
  iVar1 = QPersistentModelIndex::row();
  iVar2 = Picker::count(this->q);
  if (iVar1 == iVar2 + -1) {
    pQVar4 = this->model;
    iVar1 = this->modelColumn;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_60,&this->root);
    lVar3 = *(long *)pQVar4;
    iVar2 = 0;
  }
  else {
    pQVar4 = this->model;
    iVar2 = QPersistentModelIndex::row();
    iVar2 = iVar2 + 1;
    iVar1 = this->modelColumn;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_60,&this->root);
    lVar3 = *(long *)pQVar4;
  }
  (**(code **)(lVar3 + 0x60))(&local_48,pQVar4,iVar2,iVar1,&local_60);
  QPersistentModelIndex::operator=(index,&local_48);
  return;
}

Assistant:

void
PickerPrivate::makeNextIndex( QPersistentModelIndex & index )
{
	if( index.row() == q->count() - 1 )
		index = model->index( 0, modelColumn, root );
	else
		index = model->index( index.row() + 1, modelColumn, root );
}